

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,GeomNurbsCurves *geom,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
  *this_00;
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
  *this_01;
  TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *this_02;
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
  *pTVar3;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *pTVar4;
  TypedAttribute<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_> *pTVar5;
  TypedAttribute<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
  *this_03;
  uint32_t indent_00;
  string *psVar6;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  undefined3 in_register_00000081;
  uint32_t indent_01;
  string local_598;
  string local_578;
  string local_558;
  allocator local_531;
  undefined1 local_530 [32];
  string local_510;
  allocator local_4e9;
  undefined1 local_4e8 [32];
  string local_4c8;
  allocator local_4a1;
  undefined1 local_4a0 [32];
  string local_480;
  allocator local_459;
  undefined1 local_458 [32];
  string local_438;
  allocator local_411;
  undefined1 local_410 [32];
  string local_3f0;
  allocator local_3c9;
  undefined1 local_3c8 [32];
  string local_3a8;
  allocator local_381;
  undefined1 local_380 [32];
  string local_360;
  allocator local_339;
  undefined1 local_338 [32];
  string local_318;
  allocator local_2f1;
  undefined1 local_2f0 [32];
  string local_2d0;
  allocator local_2a9;
  undefined1 local_2a8 [32];
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [379];
  byte local_1d;
  uint local_1c;
  bool closing_brace_local;
  GeomNurbsCurves *pGStack_18;
  uint32_t indent_local;
  GeomNurbsCurves *geom_local;
  
  indent_01 = CONCAT31(in_register_00000081,closing_brace);
  local_1c = (uint)geom;
  local_1d = (byte)indent & 1;
  psVar6 = __return_storage_ptr__;
  pGStack_18 = (GeomNurbsCurves *)this;
  geom_local = (GeomNurbsCurves *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  indent_00 = (uint32_t)psVar6;
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_1c8);
  to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)(pGStack_18->super_GPrim).spec,s);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_1e8);
  poVar2 = ::std::operator<<(poVar2," NurbsCurves \"");
  poVar2 = ::std::operator<<(poVar2,(string *)&(pGStack_18->super_GPrim).name);
  ::std::operator<<(poVar2,"\"\n");
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  bVar1 = PrimMetas::authored(&(pGStack_18->super_GPrim).meta);
  n_02 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)local_1c,n_00);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_208);
    ::std::operator<<(poVar2,"(\n");
    ::std::__cxx11::string::~string((string *)&local_208);
    print_prim_metas_abi_cxx11_
              (&local_228,(tinyusdz *)&(pGStack_18->super_GPrim).meta,
               (PrimMeta *)(ulong)(local_1c + 1),indent_00);
    ::std::operator<<(aoStack_198,(string *)&local_228);
    ::std::__cxx11::string::~string((string *)&local_228);
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)local_1c,n_01);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_248);
    ::std::operator<<(poVar2,")\n");
    ::std::__cxx11::string::~string((string *)&local_248);
    n_02 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_(&local_268,(pprint *)(ulong)local_1c,n_02);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_268);
  ::std::operator<<(poVar2,"{\n");
  ::std::__cxx11::string::~string((string *)&local_268);
  this_00 = &pGStack_18->points;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_2a8,"points",&local_2a9);
  print_typed_attr<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
            ((string *)(local_2a8 + 0x20),(tinyusdz *)this_00,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
              *)local_2a8,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_2a8 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_2a8 + 0x20));
  ::std::__cxx11::string::~string((string *)local_2a8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  this_01 = &pGStack_18->normals;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_2f0,"normals",&local_2f1);
  print_typed_attr<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
            ((string *)(local_2f0 + 0x20),(tinyusdz *)this_01,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
              *)local_2f0,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_2f0 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_2f0 + 0x20));
  ::std::__cxx11::string::~string((string *)local_2f0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  this_02 = &pGStack_18->widths;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_338,"widths",&local_339);
  print_typed_attr<std::vector<float,std::allocator<float>>>
            ((string *)(local_338 + 0x20),(tinyusdz *)this_02,
             (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *)
             local_338,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_338 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_338 + 0x20));
  ::std::__cxx11::string::~string((string *)local_338);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_339);
  pTVar3 = &pGStack_18->velocities;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_380,"velocites",&local_381);
  print_typed_attr<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            ((string *)(local_380 + 0x20),(tinyusdz *)pTVar3,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
              *)local_380,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_380 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_380 + 0x20));
  ::std::__cxx11::string::~string((string *)local_380);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_381);
  pTVar3 = &pGStack_18->accelerations;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_3c8,"accelerations",&local_3c9);
  print_typed_attr<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            ((string *)(local_3c8 + 0x20),(tinyusdz *)pTVar3,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
              *)local_3c8,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_3c8 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_3c8 + 0x20));
  ::std::__cxx11::string::~string((string *)local_3c8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  pTVar4 = &pGStack_18->curveVertexCounts;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_410,"curveVertexCounts",&local_411);
  print_typed_attr<std::vector<int,std::allocator<int>>>
            ((string *)(local_410 + 0x20),(tinyusdz *)pTVar4,
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_410,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_410 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_410 + 0x20));
  ::std::__cxx11::string::~string((string *)local_410);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_411);
  pTVar4 = &pGStack_18->order;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_458,"order",&local_459);
  print_typed_attr<std::vector<int,std::allocator<int>>>
            ((string *)(local_458 + 0x20),(tinyusdz *)pTVar4,
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_458,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_458 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_458 + 0x20));
  ::std::__cxx11::string::~string((string *)local_458);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_459);
  pTVar5 = &pGStack_18->knots;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_4a0,"knots",&local_4a1);
  print_typed_attr<std::vector<double,std::allocator<double>>>
            ((string *)(local_4a0 + 0x20),(tinyusdz *)pTVar5,
             (TypedAttribute<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_> *
             )local_4a0,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_4a0 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_4a0 + 0x20));
  ::std::__cxx11::string::~string((string *)local_4a0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  this_03 = &pGStack_18->ranges;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_4e8,"ranges",&local_4e9);
  print_typed_attr<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
            ((string *)(local_4e8 + 0x20),(tinyusdz *)this_03,
             (TypedAttribute<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
              *)local_4e8,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_4e8 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_4e8 + 0x20));
  ::std::__cxx11::string::~string((string *)local_4e8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  pTVar5 = &pGStack_18->pointWeights;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_530,"pointWeights",&local_531);
  print_typed_attr<std::vector<double,std::allocator<double>>>
            ((string *)(local_530 + 0x20),(tinyusdz *)pTVar5,
             (TypedAttribute<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_> *
             )local_530,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_530 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_530 + 0x20));
  ::std::__cxx11::string::~string((string *)local_530);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_531);
  print_gprim_predefined<tinyusdz::GeomNurbsCurves>(&local_558,pGStack_18,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_558);
  ::std::__cxx11::string::~string((string *)&local_558);
  print_props(&local_578,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)&(pGStack_18->super_GPrim).props,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_578);
  ::std::__cxx11::string::~string((string *)&local_578);
  if ((local_1d & 1) != 0) {
    pprint::Indent_abi_cxx11_(&local_598,(pprint *)(ulong)local_1c,n_03);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_598);
    ::std::operator<<(poVar2,"}\n");
    ::std::__cxx11::string::~string((string *)&local_598);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const GeomNurbsCurves &geom, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(geom.spec) << " NurbsCurves \""
     << geom.name << "\"\n";
  if (geom.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(geom.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  ss << print_typed_attr(geom.points, "points", indent + 1);
  ss << print_typed_attr(geom.normals, "normals", indent + 1);
  ss << print_typed_attr(geom.widths, "widths", indent + 1);
  ss << print_typed_attr(geom.velocities, "velocites", indent + 1);
  ss << print_typed_attr(geom.accelerations, "accelerations", indent + 1);
  ss << print_typed_attr(geom.curveVertexCounts, "curveVertexCounts",
                         indent + 1);

  //
  ss << print_typed_attr(geom.order, "order", indent + 1);
  ss << print_typed_attr(geom.knots, "knots", indent + 1);
  ss << print_typed_attr(geom.ranges, "ranges", indent + 1);
  ss << print_typed_attr(geom.pointWeights, "pointWeights", indent + 1);

  ss << print_gprim_predefined(geom, indent + 1);

  ss << print_props(geom.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}